

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall yyFlexLexer::yyensure_buffer_stack(yyFlexLexer *this)

{
  size_t sVar1;
  size_t sVar2;
  yy_buffer_state **ppyVar3;
  
  if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
    ppyVar3 = (yy_buffer_state **)malloc(8);
    this->yy_buffer_stack = ppyVar3;
    if (ppyVar3 == (yy_buffer_state **)0x0) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                (this,"out of dynamic memory in yyensure_buffer_stack()");
      ppyVar3 = this->yy_buffer_stack;
    }
    *ppyVar3 = (yy_buffer_state *)0x0;
    this->yy_buffer_stack_max = 1;
    this->yy_buffer_stack_top = 0;
  }
  else {
    sVar1 = this->yy_buffer_stack_max;
    if (sVar1 - 1 <= this->yy_buffer_stack_top) {
      ppyVar3 = (yy_buffer_state **)realloc(this->yy_buffer_stack,sVar1 * 8 + 0x40);
      this->yy_buffer_stack = ppyVar3;
      if (ppyVar3 == (yy_buffer_state **)0x0) {
        (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                  (this,"out of dynamic memory in yyensure_buffer_stack()");
        ppyVar3 = this->yy_buffer_stack;
      }
      sVar2 = this->yy_buffer_stack_max;
      ppyVar3[sVar2 + 6] = (yy_buffer_state *)0x0;
      (ppyVar3 + sVar2 + 6)[1] = (yy_buffer_state *)0x0;
      ppyVar3[sVar2 + 4] = (yy_buffer_state *)0x0;
      (ppyVar3 + sVar2 + 4)[1] = (yy_buffer_state *)0x0;
      ppyVar3[sVar2 + 2] = (yy_buffer_state *)0x0;
      (ppyVar3 + sVar2 + 2)[1] = (yy_buffer_state *)0x0;
      ppyVar3[sVar2] = (yy_buffer_state *)0x0;
      (ppyVar3 + sVar2)[1] = (yy_buffer_state *)0x0;
      this->yy_buffer_stack_max = sVar1 + 8;
    }
  }
  return;
}

Assistant:

void yyFlexLexer::yyensure_buffer_stack(void)
/* %endif */
{
	yy_size_t num_to_alloc;
    
	if (!(yy_buffer_stack)) {

		/* First allocation is just for 2 elements, since we don't know if this
		 * scanner will even need a stack. We use 2 instead of 1 to avoid an
		 * immediate realloc on the next call.
         */
      num_to_alloc = 1; /* After all that talk, this was set to 1 anyways... */
		(yy_buffer_stack) = (struct yy_buffer_state**)yyalloc
								(num_to_alloc * sizeof(struct yy_buffer_state*)
								);
		if ( ! (yy_buffer_stack) )
			YY_FATAL_ERROR( "out of dynamic memory in yyensure_buffer_stack()" );

		memset((yy_buffer_stack), 0, num_to_alloc * sizeof(struct yy_buffer_state*));

		(yy_buffer_stack_max) = num_to_alloc;
		(yy_buffer_stack_top) = 0;
		return;
	}

	if ((yy_buffer_stack_top) >= ((yy_buffer_stack_max)) - 1){

		/* Increase the buffer to prepare for a possible push. */
		yy_size_t grow_size = 8 /* arbitrary grow size */;

		num_to_alloc = (yy_buffer_stack_max) + grow_size;
		(yy_buffer_stack) = (struct yy_buffer_state**)yyrealloc
								((yy_buffer_stack),
								num_to_alloc * sizeof(struct yy_buffer_state*)
								);
		if ( ! (yy_buffer_stack) )
			YY_FATAL_ERROR( "out of dynamic memory in yyensure_buffer_stack()" );

		/* zero only the new slots.*/
		memset((yy_buffer_stack) + (yy_buffer_stack_max), 0, grow_size * sizeof(struct yy_buffer_state*));
		(yy_buffer_stack_max) = num_to_alloc;
	}
}